

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomwalk.cpp
# Opt level: O0

void __thiscall RandomWalk::calcola(RandomWalk *this)

{
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  uint ith_1;
  uint ith;
  size_t sizeth;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  value_type *in_stack_ffffffffffffff98;
  uint local_54;
  uint in_stack_ffffffffffffffb0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffb4;
  type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  vector<std::thread,_std::allocator<std::thread>_> local_20;
  
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1057fd);
  uVar1 = 0;
  while ((pointer)(ulong)uVar1 <
         in_RDI[1].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
    uVar2 = uVar1;
    std::thread::thread<RandomWalk::calcola()::__0,,void>
              ((thread *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              (in_RDI,in_stack_ffffffffffffff98);
    std::thread::~thread((thread *)0x105870);
    in_stack_ffffffffffffffb0 = uVar1;
    uVar1 = uVar2 + 1;
  }
  for (local_54 = 0;
      (pointer)(ulong)local_54 <
      in_RDI[1].super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; local_54 = local_54 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_20,(ulong)local_54);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1058c7);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void RandomWalk::calcola()  noexcept{

    std::vector<std::thread> threads;
    size_t sizeth=n/nthreads;
    for (unsigned int ith=0;ith<nthreads;++ith){
        threads.push_back(std::thread([&,ith](){
            size_t start = sizeth*ith;
            size_t stop = sizeth*(ith+1);
            if (ith==nthreads-1) stop=n;
            for (size_t istep=start;istep<stop;++istep){
                randomWalk(&data[nsteps*istep],sigma,nsteps,dt,rnd[ith]);
            }
        }));
    }
    for (unsigned int ith=0;ith<nthreads;ith++)
        threads[ith].join();

    threads.clear();

}